

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void gen_initializer(c2m_ctx_t c2m_ctx,size_t init_start,op_t var,char *global_name,mir_size_t size,
                    int param_6)

{
  void *els;
  node_code_t nVar1;
  uint uVar2;
  gen_ctx_conflict *pgVar3;
  init_el_t *piVar4;
  type *ptVar5;
  MIR_context_t ctx;
  node_t_conflict pnVar6;
  expr_conflict *to_e;
  decl_t member_decl;
  MIR_context_t ctx_00;
  MIR_module_t module;
  op_t var_00;
  op_t oVar7;
  undefined1 auVar8 [64];
  undefined1 uVar9;
  undefined1 uVar10;
  undefined2 uVar11;
  undefined4 uVar12;
  MIR_type_t MVar13;
  MIR_type_t MVar14;
  int iVar15;
  MIR_alias_t alias;
  op_t *desirable_dest;
  size_t sVar16;
  MIR_item_t_conflict pMVar17;
  undefined8 uVar18;
  VARR_init_el_t *pVVar19;
  MIR_label_t label;
  DLIST_MIR_module_t *pDVar20;
  ulong uVar21;
  mir_llong mVar22;
  ulong uVar23;
  long lVar24;
  type *type;
  decl_t member_decl_00;
  ulong uVar25;
  ulong unaff_R12;
  ulong uVar26;
  long lVar27;
  char buff [50];
  MIR_op_t mem;
  op_t res;
  ulong local_1c8;
  char *local_1c0;
  MIR_disp_t local_1b8;
  ulong local_180;
  undefined1 local_178 [32];
  anon_union_32_12_57d33f68_for_u aStack_158;
  size_t local_130;
  op_t local_128;
  mir_size_t local_e0;
  MIR_op_t local_d8;
  undefined1 local_a8 [16];
  anon_union_32_12_57d33f68_for_u aStack_98;
  size_t local_78;
  undefined8 uStack_70;
  void *pvStack_68;
  undefined8 uStack_60;
  int64_t iStack_58;
  char *pcStack_50;
  undefined8 uStack_48;
  MIR_disp_t MStack_40;
  
  pgVar3 = c2m_ctx->gen_ctx;
  if (var.mir_op._8_1_ != '\x01') {
    ctx = c2m_ctx->ctx;
    local_e0 = size;
    if (param_6 == 0) {
      if (var.mir_op._8_1_ != '\b') {
        __assert_fail("var.mir_op.mode == MIR_OP_REF",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2e72,
                      "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                     );
      }
      pVVar19 = pgVar3->init_els;
      if (pVVar19 != (VARR_init_el_t *)0x0) {
        pMVar17 = (MIR_item_t_conflict)0x0;
        uVar21 = 0;
        uVar26 = init_start;
        do {
          if (pVVar19->els_num <= uVar26) {
            if (local_e0 - 1 < uVar21) {
              return;
            }
            pMVar17 = MIR_new_bss(ctx,global_name,local_e0 - uVar21);
            if (global_name == (char *)0x0) {
              return;
            }
            ((var.decl)->u).item = pMVar17;
            return;
          }
          piVar4 = pVVar19->varr;
          if (piVar4 == (init_el_t *)0x0) goto LAB_001aacdd;
          local_1c8 = piVar4[uVar26].offset;
          member_decl_00 = piVar4[uVar26].member_decl;
          ptVar5 = piVar4[uVar26].el_type;
          pnVar6 = piVar4[uVar26].init;
          if (uVar26 == init_start) {
LAB_001aa5e2:
            to_e = (expr_conflict *)pnVar6->attr;
            if ((undefined1  [64])((undefined1  [64])*to_e & (undefined1  [64])0x2) ==
                (undefined1  [64])0x0) {
              if ((undefined1  [64])((undefined1  [64])*to_e & (undefined1  [64])0x1) !=
                  (undefined1  [64])0x0) {
                cast_value(to_e,to_e,ptVar5);
                to_e->type = ptVar5;
              }
              gen((op_t *)local_178,c2m_ctx,pnVar6,(MIR_label_t)0x0,(MIR_label_t)0x0,1,(op_t *)0x0,
                  (int *)0x0);
              if (6 < (ushort)(local_178[0x18] - 3)) goto LAB_001aacf1;
            }
            local_1c0 = global_name;
            if (uVar21 <= local_1c8 && local_1c8 - uVar21 != 0) {
              pMVar17 = MIR_new_bss(ctx,global_name,local_1c8 - uVar21);
              if (global_name != (char *)0x0) {
                ((var.decl)->u).item = pMVar17;
              }
              local_1c0 = (char *)0x0;
            }
            MVar13 = get_mir_type(c2m_ctx,ptVar5);
            oVar7 = _local_178;
            if ((undefined1  [64])((undefined1  [64])*to_e & (undefined1  [64])0x2) ==
                (undefined1  [64])0x0) {
              if (local_178[0x18] == '\t') {
                if (ptVar5->mode != TM_ARR) {
                  ctx_00 = c2m_ctx->ctx;
                  pDVar20 = MIR_get_module_list(ctx_00);
                  module = pDVar20->tail;
                  _MIR_get_temp_item_name(ctx_00,module,(char *)&local_128,0x32);
                  pMVar17 = MIR_new_string_data(ctx_00,(char *)&local_128,oVar7.mir_op.u._0_16_);
                  move_item_to_module_start(module,pMVar17);
                  pMVar17 = MIR_new_ref_data(ctx,local_1c0,pMVar17,0);
                  goto LAB_001aaa71;
                }
                uVar21 = raw_type_size(c2m_ctx,ptVar5);
                uVar18 = aStack_158.i;
                if (uVar21 < aStack_158.u) {
                  pMVar17 = MIR_new_data(ctx,local_1c0,MIR_T_U8,uVar21,aStack_158.str.s);
                }
                else {
                  pMVar17 = MIR_new_string_data(ctx,local_1c0,local_178._32_16_);
                  sVar16 = uVar21 - uVar18;
                  if ((ulong)uVar18 <= uVar21 && sVar16 != 0) {
                    MIR_new_bss(ctx,(char *)0x0,sVar16);
                  }
                }
              }
              else {
                if (local_178[0x18] == '\b') {
                  mVar22 = 0;
                  uVar18 = aStack_158.i;
                  goto LAB_001aaa64;
                }
                sVar16 = _MIR_type_size(ctx,MVar13);
                uVar21 = sVar16;
                if (member_decl_00 == (decl_t)0x0) {
                  uVar25 = 0;
                }
                else {
                  uVar2 = member_decl_00->bit_offset;
                  if ((int)uVar2 < 0) {
                    uVar25 = 0;
                  }
                  else {
                    local_d8.data = (void *)0x0;
                    if (1 < (ushort)(local_178[0x18] - 3)) {
                      __assert_fail("val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                    ,0x2eb7,
                                    "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                                   );
                    }
                    local_130 = sVar16;
                    if ((uVar2 & 7) != 0) goto LAB_001aad5b;
                    add_bit_field(c2m_ctx,(uint64_t *)&local_d8,aStack_158.u,member_decl_00);
                    pVVar19 = pgVar3->init_els;
                    if (pVVar19 == (VARR_init_el_t *)0x0) goto LAB_001aace7;
                    uVar23 = uVar26 + 1;
                    if (uVar23 < pVVar19->els_num) {
                      lVar24 = uVar26 * 0x38 + 0x68;
                      uVar21 = uVar26;
                      do {
                        uVar26 = uVar21;
                        piVar4 = pVVar19->varr;
                        if (piVar4 == (init_el_t *)0x0) goto LAB_001aacec;
                        local_180 = *(ulong *)((long)piVar4 + lVar24 + -0x20);
                        if (local_180 != local_1c8) {
                          uVar23 = uVar26 + 1;
                          goto LAB_001aab07;
                        }
                        member_decl = *(decl_t *)((long)piVar4 + lVar24 + -0x18);
                        if (member_decl->bit_offset != member_decl_00->bit_offset) {
                          gen(&local_128,c2m_ctx,
                              *(node_t_conflict *)((long)&piVar4->c2m_ctx + lVar24),(MIR_label_t)0x0
                              ,(MIR_label_t)0x0,1,(op_t *)0x0,(int *)0x0);
                          oVar7.decl._1_1_ = local_128.decl._1_1_;
                          oVar7.decl._0_1_ = local_128.decl._0_1_;
                          oVar7.decl._2_2_ = local_128.decl._2_2_;
                          oVar7.decl._4_4_ = local_128.decl._4_4_;
                          oVar7._8_2_ = local_128._8_2_;
                          oVar7._10_6_ = local_128._10_6_;
                          oVar7.mir_op.data = local_128.mir_op.data;
                          oVar7.mir_op._8_8_ = local_128.mir_op._8_8_;
                          oVar7.mir_op.u.u = local_128.mir_op.u.i;
                          oVar7.mir_op.u.str.s = local_128.mir_op.u.str.s;
                          oVar7.mir_op.u._16_8_ = local_128.mir_op.u._16_8_;
                          oVar7.mir_op.u.mem.disp = local_128.mir_op.u.mem.disp;
                          local_178[0x18] = local_128.mir_op._8_1_;
                          _local_178 = oVar7;
                          if (1 < (ushort)(local_178[0x18] - 3)) {
                            __assert_fail("val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                          ,0x2ec0,
                                          "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                                         );
                          }
                          add_bit_field(c2m_ctx,(uint64_t *)&local_d8,local_128.mir_op.u.u,
                                        member_decl);
                        }
                        pVVar19 = pgVar3->init_els;
                        if (pVVar19 == (VARR_init_el_t *)0x0) goto LAB_001aace7;
                        lVar24 = lVar24 + 0x38;
                        member_decl_00 = member_decl;
                        local_1c8 = local_180;
                        uVar21 = uVar26 + 1;
                      } while (uVar26 + 2 < pVVar19->els_num);
                      uVar23 = uVar26 + 2;
                      uVar26 = uVar26 + 1;
                    }
LAB_001aab07:
                    uVar25 = (ulong)(uVar2 >> 3);
                    aStack_158.i = (int64_t)local_d8.data;
                    uVar21 = local_180 - local_1c8;
                    if (local_130 <= local_180 - local_1c8) {
                      uVar21 = local_130;
                    }
                    sVar16 = local_130;
                    if (pVVar19->els_num <= uVar23) {
                      uVar21 = local_130;
                    }
                  }
                }
                uVar12 = local_128.decl._4_4_;
                uVar11 = local_128.decl._2_2_;
                uVar10 = local_128.decl._1_1_;
                uVar9 = local_128.decl._0_1_;
                local_128.decl._0_1_ = local_178[0x20];
                local_128.decl._1_1_ = local_178[0x21];
                local_128.decl._2_2_ = local_178._34_2_;
                local_128.decl._4_4_ = local_178._36_4_;
                switch(MVar13) {
                case MIR_T_I8:
                case MIR_T_U8:
                  local_128.decl._1_1_ = uVar10;
                  local_128.decl._2_2_ = uVar11;
                  local_128.decl._4_4_ = uVar12;
                  break;
                case MIR_T_I16:
                case MIR_T_U16:
                  local_128.decl._2_2_ = uVar11;
                  local_128.decl._4_4_ = uVar12;
                  break;
                case MIR_T_I32:
                case MIR_T_U32:
                  local_128.decl._4_4_ = uVar12;
                  break;
                case MIR_T_I64:
                case MIR_T_U64:
                  break;
                case MIR_T_F:
                  local_128.decl._4_4_ = uVar12;
                  break;
                case MIR_T_D:
                  break;
                case MIR_T_LD:
                  local_128._8_2_ = local_178._40_2_;
                  break;
                default:
                  local_128.decl._0_1_ = uVar9;
                  local_128.decl._1_1_ = uVar10;
                  local_128.decl._2_2_ = uVar11;
                  local_128.decl._4_4_ = uVar12;
                  __assert_fail("FALSE",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                ,0x2ed4,
                                "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                               );
                }
                if ((uVar25 == 0) && (uVar21 == sVar16)) {
                  pMVar17 = MIR_new_data(ctx,local_1c0,MVar13,1,&local_128);
                }
                else if (uVar25 < uVar21) {
                  lVar24 = 0;
                  do {
                    els = (void *)((long)&local_128.decl + lVar24 + uVar25);
                    if (lVar24 == 0) {
                      pMVar17 = MIR_new_data(ctx,local_1c0,MIR_T_U8,1,els);
                    }
                    else {
                      MIR_new_data(ctx,(char *)0x0,MIR_T_U8,1,els);
                    }
                    lVar24 = lVar24 + 1;
                  } while (uVar21 - uVar25 != lVar24);
                }
              }
            }
            else {
              pnVar6 = to_e->def_node;
              if (pnVar6 == (node_t_conflict)0x0) {
                mVar22 = (to_e->c).i_val;
                local_128.decl._0_1_ = (undefined1)mVar22;
                local_128.decl._1_1_ = (undefined1)((ulong)mVar22 >> 8);
                local_128.decl._2_2_ = (undefined2)((ulong)mVar22 >> 0x10);
                local_128.decl._4_4_ = (undefined4)((ulong)mVar22 >> 0x20);
                pMVar17 = MIR_new_data(ctx,local_1c0,MIR_T_P,1,&local_128);
                MVar13 = MIR_T_P;
              }
              else {
                if (pnVar6->code - N_STR < 3) {
                  uVar18 = get_string_data(c2m_ctx,pnVar6);
                }
                else {
                  if (pnVar6->code == N_LABEL_ADDR) {
                    label = get_label(c2m_ctx,*(node_t_conflict *)((long)pnVar6->attr + 8));
                    pMVar17 = MIR_new_lref_data(ctx,local_1c0,label,(MIR_label_t)0x0,(to_e->c).i_val
                                               );
                    goto LAB_001aaa71;
                  }
                  uVar18 = *(undefined8 *)((long)pnVar6->attr + 0x50);
                }
                mVar22 = (to_e->c).i_val;
LAB_001aaa64:
                pMVar17 = MIR_new_ref_data(ctx,local_1c0,(MIR_item_t_conflict)uVar18,mVar22);
              }
LAB_001aaa71:
              uVar21 = _MIR_type_size(ctx,MVar13);
            }
            if (local_1c0 != (char *)0x0) {
              ((var.decl)->u).item = pMVar17;
            }
            uVar21 = uVar21 + local_1c8;
            global_name = (char *)0x0;
          }
          else {
            if (pVVar19->els_num <= uVar26 - 1) goto LAB_001aace2;
            if ((local_1c8 != piVar4[uVar26 - 1].offset) ||
               ((member_decl_00 != (decl_t)0x0 && (-1 < member_decl_00->bit_offset))))
            goto LAB_001aa5e2;
          }
          uVar26 = uVar26 + 1;
          pVVar19 = pgVar3->init_els;
        } while (pVVar19 != (VARR_init_el_t *)0x0);
      }
LAB_001aacd8:
      gen_initializer_cold_7();
LAB_001aacdd:
      gen_initializer_cold_6();
LAB_001aace2:
      gen_initializer_cold_3();
LAB_001aace7:
      gen_initializer_cold_5();
LAB_001aacec:
      gen_initializer_cold_4();
LAB_001aacf1:
      __assert_fail("val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT || val.mir_op.mode == MIR_OP_FLOAT || val.mir_op.mode == MIR_OP_DOUBLE || val.mir_op.mode == MIR_OP_LDOUBLE || val.mir_op.mode == MIR_OP_STR || val.mir_op.mode == MIR_OP_REF"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2e82,
                    "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)");
    }
    if ((var.mir_op._8_1_ != '\n') || (var.mir_op.u.mem.index != 0)) {
      __assert_fail("var.mir_op.mode == MIR_OP_MEM && var.mir_op.u.mem.index == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2e4b,
                    "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)");
    }
    pVVar19 = pgVar3->init_els;
    uVar12 = (MIR_reg_t)local_1c8;
    if (pVVar19 != (VARR_init_el_t *)0x0) {
      local_1b8 = var.mir_op.u.mem.disp;
      lVar24 = init_start * 0x38 + 0x30;
      lVar27 = 0;
      unaff_R12 = 0;
      do {
        if (pVVar19->els_num <= init_start + lVar27) goto LAB_001aa525;
        piVar4 = pVVar19->varr;
        if (piVar4 == (init_el_t *)0x0) {
          gen_initializer_cold_1();
          goto LAB_001aacd8;
        }
        uVar26 = *(ulong *)((long)piVar4 + lVar24 + -0x20);
        local_130 = *(size_t *)((long)piVar4 + lVar24 + -0x18);
        ptVar5 = *(type **)((long)piVar4 + lVar24 + -0x10);
        type = *(type **)((long)piVar4 + lVar24 + -8);
        pnVar6 = *(node_t_conflict *)((long)&piVar4->c2m_ctx + lVar24);
        MVar13 = get_mir_type(c2m_ctx,ptVar5);
        if (unaff_R12 <= uVar26 && uVar26 - unaff_R12 != 0) {
          gen_memset(c2m_ctx,unaff_R12 + var.mir_op.u.mem.disp,var.mir_op.u.mem.base,
                     uVar26 - unaff_R12);
          unaff_R12 = uVar26;
        }
        if (MVar13 == MIR_T_UNDEF) {
          MIR_new_mem_op((MIR_op_t *)local_a8,ctx,MIR_T_UNDEF,unaff_R12 + var.mir_op.u.mem.disp,
                         var.mir_op.u.mem.base,0,'\x01');
          local_128.mir_op.u._8_8_ = aStack_98._16_8_;
          local_128.mir_op.u._16_8_ = aStack_98.mem.disp;
          local_128._8_2_ = SUB82(local_a8._0_8_,0);
          local_128._10_6_ = SUB86(local_a8._0_8_,2);
          local_128.mir_op.data = (void *)local_a8._8_8_;
          local_128.mir_op._8_8_ = aStack_98.i;
          local_128.mir_op.u.i = aStack_98._8_8_;
          local_178 = local_178._8_32_ << 0x40;
          auVar8[1] = local_128.decl._1_1_;
          auVar8[0] = local_128.decl._0_1_;
          auVar8._2_2_ = local_128.decl._2_2_;
          auVar8._4_4_ = local_128.decl._4_4_;
          aStack_158.i = aStack_98.i;
          aStack_158.str.s = aStack_98.str.s;
          aStack_158._16_8_ = aStack_98._16_8_;
          aStack_158.mem.disp = aStack_98.mem.disp;
          auVar8._8_8_ = local_a8._0_8_;
          auVar8._16_8_ = local_a8._8_8_;
          auVar8._24_8_ = aStack_98.i;
          auVar8._32_24_ = aStack_158._8_24_;
          auVar8._56_8_ = 0;
          _local_178 = (op_t)(auVar8 << 0x40);
        }
        desirable_dest = (op_t *)local_178;
        if (MVar13 != MIR_T_UNDEF) {
          desirable_dest = (op_t *)0x0;
        }
        gen(&local_128,c2m_ctx,pnVar6,(MIR_label_t)0x0,(MIR_label_t)0x0,
            (uint)(MVar13 != MIR_T_UNDEF),desirable_dest,(int *)0x0);
        local_178[1] = local_128.decl._1_1_;
        local_178[0] = local_128.decl._0_1_;
        local_178._2_2_ = local_128.decl._2_2_;
        local_178._4_4_ = local_128.decl._4_4_;
        local_178._10_6_ = local_128._10_6_;
        local_178._8_2_ = local_128._8_2_;
        local_178._16_8_ = local_128.mir_op.data;
        local_178._24_8_ = local_128.mir_op._8_8_;
        aStack_158.i = local_128.mir_op.u.i;
        aStack_158.str.s = local_128.mir_op.u.str.s;
        aStack_158._16_8_ = local_128.mir_op.u._16_8_;
        aStack_158.mem.disp = local_128.mir_op.u.mem.disp;
        iVar15 = scalar_type_p(ptVar5);
        if (iVar15 == 0) {
          nVar1 = pnVar6->code;
          if (nVar1 == N_STR32) {
            sVar16 = (pnVar6->u).s.len >> 2;
          }
          else if (nVar1 == N_STR16) {
            sVar16 = (pnVar6->u).s.len >> 1;
          }
          else if (nVar1 == N_STR) {
            sVar16 = (pnVar6->u).s.len;
          }
          else {
            sVar16 = raw_type_size(c2m_ctx,ptVar5);
          }
          gen_memcpy(c2m_ctx,unaff_R12 + var.mir_op.u.mem.disp,var.mir_op.u.mem.base,_local_178,
                     sVar16);
        }
        else {
          if ((type == (type *)0x0) || (type->mode != TM_UNION)) {
            type = ptVar5;
          }
          alias = get_type_alias(c2m_ctx,type);
          MIR_new_alias_mem_op
                    (&local_d8,ctx,MVar13,uVar26 + var.mir_op.u.mem.disp,var.mir_op.u.mem.base,0,
                     '\x01',alias,0);
          MVar14 = get_mir_type(c2m_ctx,ptVar5);
          cast(&local_128,c2m_ctx,_local_178,MVar14,0);
          local_178[1] = local_128.decl._1_1_;
          local_178[0] = local_128.decl._0_1_;
          local_178._2_2_ = local_128.decl._2_2_;
          local_178._4_4_ = local_128.decl._4_4_;
          local_178._10_6_ = local_128._10_6_;
          local_178._8_2_ = local_128._8_2_;
          local_178._16_8_ = local_128.mir_op.data;
          local_178._24_8_ = local_128.mir_op._8_8_;
          aStack_158.i = local_128.mir_op.u.i;
          aStack_158.str.s = local_128.mir_op.u.str.s;
          aStack_158._16_8_ = local_128.mir_op.u._16_8_;
          aStack_158.mem.disp = local_128.mir_op.u.mem.disp;
          uStack_48 = local_d8.u._16_8_;
          MStack_40 = local_d8.u.mem.disp;
          pvStack_68 = local_d8.data;
          uStack_60 = local_d8._8_8_;
          iStack_58 = local_d8.u.i;
          pcStack_50 = local_d8.u.str.s;
          local_78 = local_130;
          var_00._8_4_ = (int)uStack_70;
          var_00.decl = (decl_t)local_130;
          var_00._12_4_ = (int)((ulong)uStack_70 >> 0x20);
          var_00.mir_op.data._0_4_ = (int)local_d8.data;
          var_00.mir_op.data._4_4_ = (int)((ulong)local_d8.data >> 0x20);
          var_00.mir_op._8_8_ = local_d8._8_8_;
          var_00.mir_op.u.i = local_d8.u.i;
          var_00.mir_op.u.str.s = local_d8.u.str.s;
          var_00.mir_op.u._16_8_ = local_d8.u._16_8_;
          var_00.mir_op.u.mem.disp = local_d8.u.mem.disp;
          emit_scalar_assign(c2m_ctx,var_00,(op_t *)local_178,MVar13,
                             (uint)(unaff_R12 == uVar26 || lVar27 == 0));
          sVar16 = _MIR_type_size(ctx,MVar13);
        }
        unaff_R12 = sVar16 + uVar26;
        pVVar19 = pgVar3->init_els;
        lVar27 = lVar27 + 1;
        lVar24 = lVar24 + 0x38;
        uVar12 = var.mir_op.u.mem.base;
      } while (pVVar19 != (VARR_init_el_t *)0x0);
    }
    var.mir_op.u.mem.base = uVar12;
    gen_initializer_cold_2();
LAB_001aa525:
    if (unaff_R12 <= local_e0 && local_e0 - unaff_R12 != 0) {
      gen_memset(c2m_ctx,unaff_R12 + local_1b8,var.mir_op.u.mem.base,local_e0 - unaff_R12);
    }
    return;
  }
  if (param_6 != 0) {
    pVVar19 = pgVar3->init_els;
    if (pVVar19 == (VARR_init_el_t *)0x0) {
      gen_initializer_cold_9();
    }
    else {
      if (pVVar19->els_num - init_start != 1) goto LAB_001aad32;
      if ((init_start < pVVar19->els_num) && (piVar4 = pVVar19->varr, piVar4 != (init_el_t *)0x0)) {
        ptVar5 = piVar4[init_start].el_type;
        gen((op_t *)local_178,c2m_ctx,piVar4[init_start].init,(MIR_label_t)0x0,(MIR_label_t)0x0,1,
            (op_t *)0x0,(int *)0x0);
        MVar13 = get_op_type(c2m_ctx,var);
        MVar14 = get_mir_type(c2m_ctx,ptVar5);
        cast(&local_128,c2m_ctx,_local_178,MVar14,0);
        emit_scalar_assign(c2m_ctx,var,(op_t *)local_178,MVar13,0);
        return;
      }
    }
    gen_initializer_cold_8();
LAB_001aad5b:
    __assert_fail("init_el.member_decl->bit_offset % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2eb8,
                  "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)");
  }
LAB_001aad32:
  __assert_fail("local_p && offset == 0 && VARR_LENGTH (init_el_t, init_els) - init_start == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x2e44,
                "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)");
}

Assistant:

static void gen_initializer (c2m_ctx_t c2m_ctx, size_t init_start, op_t var,
                             const char *global_name, mir_size_t size, int local_p) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t val;
  size_t str_len;
  mir_size_t data_size, el_size, offset = 0, rel_offset = 0, start_offset;
  init_el_t init_el, next_init_el;
  MIR_reg_t base;
  MIR_type_t t;
  MIR_item_t data = NULL; /* to remove a warning */
  struct expr *e;

  if (var.mir_op.mode == MIR_OP_REG) { /* scalar initialization: */
    assert (local_p && offset == 0 && VARR_LENGTH (init_el_t, init_els) - init_start == 1);
    init_el = VARR_GET (init_el_t, init_els, init_start);
    val = val_gen (c2m_ctx, init_el.init);
    t = get_op_type (c2m_ctx, var);
    val = cast (c2m_ctx, val, get_mir_type (c2m_ctx, init_el.el_type), FALSE);
    emit_scalar_assign (c2m_ctx, var, &val, t, FALSE);
  } else if (local_p) { /* local variable initialization: */
    assert (var.mir_op.mode == MIR_OP_MEM && var.mir_op.u.mem.index == 0); /*???*/
    offset = var.mir_op.u.mem.disp;
    base = var.mir_op.u.mem.base;
    for (size_t i = init_start; i < VARR_LENGTH (init_el_t, init_els); i++) {
      init_el = VARR_GET (init_el_t, init_els, i);
      t = get_mir_type (c2m_ctx, init_el.el_type);
      if (rel_offset < init_el.offset) { /* fill the gap: */
        gen_memset (c2m_ctx, offset + rel_offset, base, init_el.offset - rel_offset);
        rel_offset = init_el.offset;
      }
      if (t == MIR_T_UNDEF)
        val = new_op (NULL, MIR_new_mem_op (ctx, t, offset + rel_offset, base, 0, 1));
      val = gen (c2m_ctx, init_el.init, NULL, NULL, t != MIR_T_UNDEF,
                 t != MIR_T_UNDEF ? NULL : &val, NULL);
      if (!scalar_type_p (init_el.el_type)) {
        mir_size_t s = init_el.init->code == N_STR     ? init_el.init->u.s.len
                       : init_el.init->code == N_STR16 ? init_el.init->u.s.len / 2
                       : init_el.init->code == N_STR32 ? init_el.init->u.s.len / 4
                                                       : raw_type_size (c2m_ctx, init_el.el_type);
        gen_memcpy (c2m_ctx, offset + rel_offset, base, val, s);
        rel_offset = init_el.offset + s;
      } else {
        MIR_op_t mem
          = MIR_new_alias_mem_op (ctx, t, offset + init_el.offset, base, 0, 1,
                                  get_type_alias (c2m_ctx,
                                                  init_el.container_type != NULL
                                                      && init_el.container_type->mode == TM_UNION
                                                    ? init_el.container_type
                                                    : init_el.el_type),
                                  0);
        val = cast (c2m_ctx, val, get_mir_type (c2m_ctx, init_el.el_type), FALSE);
        emit_scalar_assign (c2m_ctx, new_op (init_el.member_decl, mem), &val, t,
                            i == init_start || rel_offset == init_el.offset);
        rel_offset = init_el.offset + _MIR_type_size (ctx, t);
      }
    }
    if (rel_offset < size) /* fill the tail: */
      gen_memset (c2m_ctx, offset + rel_offset, base, size - rel_offset);
  } else {
    assert (var.mir_op.mode == MIR_OP_REF);
    for (size_t i = init_start; i < VARR_LENGTH (init_el_t, init_els); i++) {
      init_el = VARR_GET (init_el_t, init_els, i);
      if (i != init_start && init_el.offset == VARR_GET (init_el_t, init_els, i - 1).offset
          && (init_el.member_decl == NULL || init_el.member_decl->bit_offset < 0))
        continue;
      e = init_el.init->attr;
      if (!e->const_addr_p) {
        if (e->const_p) {
          convert_value (e, init_el.el_type);
          e->type = init_el.el_type; /* to get the right value in the subsequent gen call */
        }
        val = val_gen (c2m_ctx, init_el.init);
        assert (val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT
                || val.mir_op.mode == MIR_OP_FLOAT || val.mir_op.mode == MIR_OP_DOUBLE
                || val.mir_op.mode == MIR_OP_LDOUBLE || val.mir_op.mode == MIR_OP_STR
                || val.mir_op.mode == MIR_OP_REF);
      }
      if (rel_offset < init_el.offset) { /* fill the gap: */
        data = MIR_new_bss (ctx, global_name, init_el.offset - rel_offset);
        if (global_name != NULL) var.decl->u.item = data;
        global_name = NULL;
      }
      t = get_mir_type (c2m_ctx, init_el.el_type);
      if (e->const_addr_p) {
        node_t def;

        if ((def = e->def_node) == NULL) { /* constant address */
          mir_size_t s = e->c.i_val;
          data = MIR_new_data (ctx, global_name, MIR_T_P, 1, &s);
          data_size = _MIR_type_size (ctx, MIR_T_P);
        } else if (def->code == N_LABEL_ADDR) {
          data = MIR_new_lref_data (ctx, global_name,
                                    get_label (c2m_ctx,
                                               ((struct expr *) def->attr)->u.label_addr_target),
                                    NULL, e->c.i_val);
          data_size = _MIR_type_size (ctx, t);
        } else {
          if (def->code != N_STR && def->code != N_STR16 && def->code != N_STR32) {
            data = ((decl_t) def->attr)->u.item;
          } else {
            data = get_string_data (c2m_ctx, def);
          }
          data = MIR_new_ref_data (ctx, global_name, data, e->c.i_val);
          data_size = _MIR_type_size (ctx, t);
        }
      } else if (val.mir_op.mode == MIR_OP_REF) {
        data = MIR_new_ref_data (ctx, global_name, val.mir_op.u.ref, 0);
        data_size = _MIR_type_size (ctx, t);
      } else if (val.mir_op.mode != MIR_OP_STR) {
        union {
          int8_t i8;
          uint8_t u8;
          int16_t i16;
          uint16_t u16;
          int32_t i32;
          uint32_t u32;
          int64_t i64;
          uint64_t u64;
          float f;
          double d;
          long double ld;
          uint8_t data[8];
        } u;
        start_offset = 0;
        el_size = data_size = _MIR_type_size (ctx, t);
        if (init_el.member_decl != NULL && init_el.member_decl->bit_offset >= 0) {
          uint64_t uval = 0;

          assert (val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT);
          assert (init_el.member_decl->bit_offset % 8 == 0); /* first in the group of bitfields */
          start_offset = init_el.member_decl->bit_offset / 8;
          add_bit_field (c2m_ctx, &uval, val.mir_op.u.u, init_el.member_decl);
          for (; i + 1 < VARR_LENGTH (init_el_t, init_els); i++, init_el = next_init_el) {
            next_init_el = VARR_GET (init_el_t, init_els, i + 1);
            if (next_init_el.offset != init_el.offset) break;
            if (next_init_el.member_decl->bit_offset == init_el.member_decl->bit_offset) continue;
            val = val_gen (c2m_ctx, next_init_el.init);
            assert (val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT);
            add_bit_field (c2m_ctx, &uval, val.mir_op.u.u, next_init_el.member_decl);
          }
          val.mir_op.u.u = uval;
          if (i + 1 < VARR_LENGTH (init_el_t, init_els)
              && next_init_el.offset - init_el.offset < data_size)
            data_size = next_init_el.offset - init_el.offset;
        }
        switch (t) {
        case MIR_T_I8: u.i8 = (int8_t) val.mir_op.u.i; break;
        case MIR_T_U8: u.u8 = (uint8_t) val.mir_op.u.u; break;
        case MIR_T_I16: u.i16 = (int16_t) val.mir_op.u.i; break;
        case MIR_T_U16: u.u16 = (uint16_t) val.mir_op.u.u; break;
        case MIR_T_I32: u.i32 = (int32_t) val.mir_op.u.i; break;
        case MIR_T_U32: u.u32 = (uint32_t) val.mir_op.u.u; break;
        case MIR_T_I64: u.i64 = val.mir_op.u.i; break;
        case MIR_T_U64: u.u64 = val.mir_op.u.u; break;
        case MIR_T_F: u.f = val.mir_op.u.f; break;
        case MIR_T_D: u.d = val.mir_op.u.d; break;
        case MIR_T_LD: u.ld = val.mir_op.u.ld; break;
        default: assert (FALSE);
        }
        if (start_offset == 0 && data_size == el_size) {
          data = MIR_new_data (ctx, global_name, t, 1, &u);
        } else {
          for (mir_size_t byte_num = start_offset; byte_num < data_size; byte_num++) {
            if (byte_num == start_offset)
              data = MIR_new_data (ctx, global_name, MIR_T_U8, 1, &u.data[byte_num]);
            else
              MIR_new_data (ctx, NULL, MIR_T_U8, 1, &u.data[byte_num]);
          }
        }
      } else if (init_el.el_type->mode == TM_ARR) {
        data_size = raw_type_size (c2m_ctx, init_el.el_type);
        str_len = val.mir_op.u.str.len;
        if (data_size < str_len) {
          data = MIR_new_data (ctx, global_name, MIR_T_U8, data_size, val.mir_op.u.str.s);
        } else {
          data = MIR_new_string_data (ctx, global_name, val.mir_op.u.str);
          if (data_size > str_len) MIR_new_bss (ctx, NULL, data_size - str_len);
        }
      } else {
        data = get_mir_str_op_data (c2m_ctx, val.mir_op.u.str);
        data = MIR_new_ref_data (ctx, global_name, data, 0);
        data_size = _MIR_type_size (ctx, t);
      }
      if (global_name != NULL) var.decl->u.item = data;
      global_name = NULL;
      rel_offset = init_el.offset + data_size;
    }
    if (rel_offset < size || size == 0) { /* fill the tail: */
      data = MIR_new_bss (ctx, global_name, size - rel_offset);
      if (global_name != NULL) var.decl->u.item = data;
    }
  }
}